

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_vpvp.c
# Opt level: O3

void * ares_htable_vpvp_get_direct(ares_htable_vpvp_t *htable,void *key)

{
  void *pvVar1;
  
  if (htable != (ares_htable_vpvp_t *)0x0) {
    pvVar1 = ares_htable_get(htable->hash,key);
    if (pvVar1 == (void *)0x0) {
      pvVar1 = (void *)0x0;
    }
    else {
      pvVar1 = *(void **)((long)pvVar1 + 8);
    }
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

ares_bool_t ares_htable_vpvp_get(const ares_htable_vpvp_t *htable,
                                 const void *key, void **val)
{
  ares_htable_vpvp_bucket_t *bucket = NULL;

  if (val) {
    *val = NULL;
  }

  if (htable == NULL) {
    return ARES_FALSE;
  }

  bucket = ares_htable_get(htable->hash, key);
  if (bucket == NULL) {
    return ARES_FALSE;
  }

  if (val) {
    *val = bucket->val;
  }
  return ARES_TRUE;
}